

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<solitaire::interfaces::Solitaire_&()>::UntypedPerformAction
          (FunctionMocker<solitaire::interfaces::Solitaire_&()> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<solitaire::interfaces::Solitaire_&> *pAVar1;
  ArgumentTuple *args;
  Action<solitaire::interfaces::Solitaire_&()> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<solitaire::interfaces::Solitaire_&()> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<solitaire::interfaces::Solitaire_&()>::Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)&args,
             (Action<solitaire::interfaces::Solitaire_&()> *)untyped_action);
  pAVar1 = ActionResultHolder<solitaire::interfaces::Solitaire&>::
           PerformAction<solitaire::interfaces::Solitaire&()>
                     ((Action<solitaire::interfaces::Solitaire_&()> *)&args,
                      (ArgumentTuple *)action.fun_._M_invoker);
  Action<solitaire::interfaces::Solitaire_&()>::~Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)&args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }